

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priIsSieved(word *a,size_t n,size_t base_count,void *stack)

{
  bool bVar1;
  bool_t bVar2;
  size_t n_00;
  word wVar3;
  long in_RCX;
  long lVar4;
  long in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *unaff_retaddr;
  word *mods;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  n_00 = wwWordSize(in_RDI,in_RSI);
  bVar2 = zzIsEven(in_RDI,n_00);
  if (bVar2 == 0) {
    local_20 = in_RDX;
    if (n_00 == 1) {
      while( true ) {
        bVar1 = false;
        if (local_20 != 0) {
          wVar3 = priBasePrime(local_20 - 1);
          bVar1 = *in_RDI < wVar3;
        }
        if (!bVar1) break;
        local_20 = local_20 + -1;
      }
    }
    priBaseMod(unaff_retaddr,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (size_t)in_RDI,n_00);
    do {
      lVar4 = local_20 + -1;
      if (local_20 == 0) {
        return 1;
      }
      local_20 = lVar4;
    } while (*(long *)(in_RCX + lVar4 * 8) != 0);
  }
  return 0;
}

Assistant:

bool_t priIsSieved(const word a[], size_t n, size_t base_count, void* stack)
{
	// переменные в stack
	word* mods;
	// pre
	ASSERT(base_count <= priBaseSize());
	// четное?
	n = wwWordSize(a, n);
	if (zzIsEven(a, n))
		return FALSE;
	// малое a?
	if (n == 1)
		// при необходимости скорректировать факторную базу
		while (base_count > 0 && priBasePrime(base_count - 1) > a[0])
			--base_count;
	// раскладка stack
	mods = (word*)stack;
	// найти остатки
	priBaseMod(mods, a, n, base_count);
	// есть нулевые остатки?
	while (base_count--)
		if (mods[base_count] == 0)
			return FALSE;
	// нет
	return TRUE;
}